

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe10At5(uint8_t *buf)

{
  uint64_t res;
  uint8_t *buf_local;
  
  return (long)((int)(uint)buf[1] >> 1) | ((ulong)*buf & 7) << 7;
}

Assistant:

std::uint64_t readFlUIntBe10At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 7;
    res |= (buf[1] >> 1);
    res &= UINT64_C(0x3ff);
    return res;
}